

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

void __thiscall
helics::MessageFederate::registerMessageInterfaces(MessageFederate *this,string *configString)

{
  ConfigType CVar1;
  string_view configString_00;
  
  configString_00._M_str = (configString->_M_dataplus)._M_p;
  configString_00._M_len = configString->_M_string_length;
  CVar1 = fileops::getConfigType(configString_00);
  if (1 < CVar1 - TOML_STRING) {
    if (CVar1 < TOML_STRING) {
      registerMessageInterfacesJson(this,configString);
    }
    return;
  }
  registerMessageInterfacesToml(this,configString);
  return;
}

Assistant:

void MessageFederate::registerMessageInterfaces(const std::string& configString)
{
    auto hint = fileops::getConfigType(configString);
    switch (hint) {
        case fileops::ConfigType::JSON_FILE:
        case fileops::ConfigType::JSON_STRING:
            try {
                registerMessageInterfacesJson(configString);
            }
            catch (const std::invalid_argument& e) {
                throw(helics::InvalidParameter(e.what()));
            }
            break;
        case fileops::ConfigType::TOML_FILE:
        case fileops::ConfigType::TOML_STRING:
            registerMessageInterfacesToml(configString);
            break;
        case fileops::ConfigType::NONE:
        default:
            break;
    }
}